

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

bool __thiscall BCLog::Logger::WillLogCategoryLevel(Logger *this,LogFlags category,Level level)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  Level LVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  bool bVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = true;
  if ((int)level < 2) {
    if (((this->m_categories).super___atomic_base<unsigned_long>._M_i & category) == NONE) {
      bVar9 = false;
    }
    else {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
      if (iVar3 != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_system_error(iVar3);
        }
        goto LAB_001d9bc0;
      }
      uVar2 = (this->m_category_log_levels)._M_h._M_bucket_count;
      uVar6 = (ulong)category % uVar2;
      p_Var7 = (this->m_category_log_levels)._M_h._M_buckets[uVar6];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var7 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var7->_M_nxt, p_Var8 = p_Var7,
         p_Var7->_M_nxt[1]._M_nxt != (_Hash_node_base *)category)) {
        while (p_Var7 = p_Var5, p_Var5 = p_Var7->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)p_Var5[1]._M_nxt % uVar2 != uVar6) ||
             (p_Var8 = p_Var7, p_Var5[1]._M_nxt == (_Hash_node_base *)category)) goto LAB_001d9b63;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_001d9b63:
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var5 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var5 = p_Var8->_M_nxt;
      }
      if (p_Var5 == (_Hash_node_base *)0x0) {
        LVar4 = (this->m_log_level)._M_i;
      }
      else {
        LVar4 = *(Level *)&p_Var5[2]._M_nxt;
      }
      bVar9 = (int)LVar4 <= (int)level;
      pthread_mutex_unlock((pthread_mutex_t *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar9;
  }
LAB_001d9bc0:
  __stack_chk_fail();
}

Assistant:

bool BCLog::Logger::WillLogCategoryLevel(BCLog::LogFlags category, BCLog::Level level) const
{
    // Log messages at Info, Warning and Error level unconditionally, so that
    // important troubleshooting information doesn't get lost.
    if (level >= BCLog::Level::Info) return true;

    if (!WillLogCategory(category)) return false;

    StdLockGuard scoped_lock(m_cs);
    const auto it{m_category_log_levels.find(category)};
    return level >= (it == m_category_log_levels.end() ? LogLevel() : it->second);
}